

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

char * basename(char *__filename)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *filepath_local;
  string *basedir;
  
  local_19 = 0;
  local_18 = in_RSI;
  filepath_local = (string *)__filename;
  std::__cxx11::string::string((string *)__filename);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of(local_18,"/\\",0xffffffffffffffff);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,".");
  }
  else {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_of(local_18,"/\\",0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_40,local_18,0,sVar1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,
               &local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,"/");
  return __filename;
}

Assistant:

std::string basename(const std::string & filepath)
{
  std::string basedir;
  if (filepath.find_last_of("/\\") != std::string::npos) {
    basedir = filepath.substr(0, filepath.find_last_of("/\\"));
  } else {
    basedir = ".";
  }
#ifdef _WIN32
  basedir += "\\";
#else
  basedir += "/";
#endif
  return basedir;
}